

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

QLayoutItem * __thiscall
QFormLayoutPrivate::replaceAt(QFormLayoutPrivate *this,int index,QLayoutItem *newitem)

{
  QFormLayoutItem **ppQVar1;
  long *plVar2;
  long lVar3;
  QFormLayoutItem *pQVar4;
  pointer ppQVar5;
  int iVar6;
  QFormLayoutItem **in_RCX;
  QFormLayoutItem **ppQVar7;
  QLayoutItem *pQVar8;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (newitem == (QLayoutItem *)0x0) {
    pQVar8 = (QLayoutItem *)0x0;
    goto LAB_003a12cf;
  }
  if ((ulong)(long)index < (ulong)(this->m_things).d.size) {
    in_RCX = (this->m_things).d.ptr;
    pQVar4 = in_RCX[index];
  }
  else {
    pQVar4 = (QFormLayoutItem *)0x0;
  }
  if (pQVar4 == (QFormLayoutItem *)0x0) {
    iVar6 = -1;
  }
  else {
    lVar3 = (this->m_matrix).m_storage.d.size;
    if (lVar3 != 0) {
      ppQVar7 = (QFormLayoutItem **)0xfffffffffffffff8;
      do {
        iVar6 = (int)in_RCX;
        ppQVar1 = ppQVar7 + -lVar3;
        if (ppQVar1 == (QFormLayoutItem **)0xfffffffffffffff8) goto LAB_003a1290;
        in_RCX = ppQVar7 + 1;
        plVar2 = (long *)((long)((this->m_matrix).m_storage.d.ptr + 1) + (long)ppQVar7);
        ppQVar7 = in_RCX;
      } while ((QFormLayoutItem *)*plVar2 != pQVar4);
      iVar6 = (int)((long)in_RCX >> 3);
LAB_003a1290:
      if (ppQVar1 != (QFormLayoutItem **)0xfffffffffffffff8) goto LAB_003a12a4;
    }
    iVar6 = -1;
  }
LAB_003a12a4:
  if (iVar6 == -1) {
    local_40[0] = '\x02';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    local_40[8] = '\0';
    local_40[9] = '\0';
    local_40[10] = '\0';
    local_40[0xb] = '\0';
    local_40[0xc] = '\0';
    local_40[0xd] = '\0';
    local_40[0xe] = '\0';
    local_40[0xf] = '\0';
    local_40[0x10] = '\0';
    local_40[0x11] = '\0';
    local_40[0x12] = '\0';
    local_40[0x13] = '\0';
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    local_28 = "default";
    pQVar8 = (QLayoutItem *)0x0;
    QMessageLogger::warning(local_40,"QFormLayoutPrivate::replaceAt: Invalid index %d",index);
  }
  else {
    plVar2 = *(long **)&(this->super_QLayoutPrivate).field_0x8;
    ppQVar5 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
    pQVar8 = ppQVar5[iVar6]->item;
    ppQVar5[iVar6]->item = newitem;
    (**(code **)(*plVar2 + 0x70))(plVar2);
  }
LAB_003a12cf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar8;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem* QFormLayoutPrivate::replaceAt(int index, QLayoutItem *newitem)
{
    Q_Q(QFormLayout);
    if (!newitem)
        return nullptr;
    const int storageIndex = storageIndexFromLayoutItem(m_matrix, m_things.value(index));
    if (Q_UNLIKELY(storageIndex == -1)) {
        // ### Qt6 - fix warning too when this class becomes public
        qWarning("QFormLayoutPrivate::replaceAt: Invalid index %d", index);
        return nullptr;
    }

    int row, col;
    QFormLayoutPrivate::ItemMatrix::storageIndexToPosition(storageIndex, &row, &col);
    Q_ASSERT(m_matrix(row, col));

    QFormLayoutItem *item = m_matrix(row, col);
    Q_ASSERT(item);

    QLayoutItem *olditem = item->item;
    item->item = newitem;

    q->invalidate();
    return olditem;
}